

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::BinaryOp<8,_(rsg::Associativity)0>::BinaryOp
          (BinaryOp<8,_(rsg::Associativity)0> *this,Type operatorToken)

{
  Type operatorToken_local;
  BinaryOp<8,_(rsg::Associativity)0> *this_local;
  
  Expression::Expression(&this->super_Expression);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__BinaryOp_015d0248;
  this->m_operator = operatorToken;
  VariableType::VariableType(&this->m_type);
  ValueStorage<64>::ValueStorage(&this->m_value);
  ValueRange::ValueRange(&this->m_leftValueRange,&this->m_type);
  ValueRange::ValueRange(&this->m_rightValueRange,&this->m_type);
  this->m_leftValueExpr = (Expression *)0x0;
  this->m_rightValueExpr = (Expression *)0x0;
  return;
}

Assistant:

BinaryOp<Precedence, Assoc>::BinaryOp (Token::Type operatorToken)
	: m_operator		(operatorToken)
	, m_leftValueRange	(m_type)
	, m_rightValueRange	(m_type)
	, m_leftValueExpr	(DE_NULL)
	, m_rightValueExpr	(DE_NULL)
{
}